

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O2

void __thiscall PathAlias::PathAlias(PathAlias *this,char *path)

{
  string local_40;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_19);
  PathAlias(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

PathAlias(const char* path) : PathAlias(std::string(path)) {}